

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_util_tracesnap(lua_State *L)

{
  byte bVar1;
  uint uVar2;
  SnapShot *pSVar3;
  SnapEntry *pSVar4;
  uint uVar5;
  GCtrace *pGVar6;
  TValue *pTVar7;
  int iVar8;
  ulong uVar9;
  uint narray;
  long lVar10;
  GCtab *t;
  
  pGVar6 = jit_checktrace(L);
  uVar5 = lj_lib_checkint(L,2);
  iVar8 = 0;
  if ((pGVar6 != (GCtrace *)0x0) && (uVar5 < pGVar6->nsnap)) {
    pSVar3 = pGVar6->snap;
    uVar2 = pSVar3[uVar5].mapofs;
    pSVar4 = pGVar6->snapmap;
    bVar1 = pSVar3[uVar5].nent;
    narray = bVar1 + 2;
    lua_createtable(L,narray,0);
    t = (GCtab *)(L->top[-1].u64 & 0x7fffffffffff);
    if (t->asize == 0) {
      pTVar7 = lj_tab_setinth(L,t,0);
    }
    else {
      pTVar7 = (TValue *)(t->array).ptr64;
    }
    pTVar7->n = (double)(int)(pSVar3[uVar5].ref - 0x8000);
    if (t->asize < 2) {
      pTVar7 = lj_tab_setinth(L,t,1);
    }
    else {
      pTVar7 = (TValue *)((t->array).ptr64 + 8);
    }
    pTVar7->n = (double)pSVar3[uVar5].nslots;
    lVar10 = 0x10;
    for (uVar9 = 0; bVar1 != uVar9; uVar9 = uVar9 + 1) {
      if (uVar9 + 2 < (ulong)t->asize) {
        pTVar7 = (TValue *)((t->array).ptr64 + lVar10);
      }
      else {
        pTVar7 = lj_tab_setinth(L,t,(int)uVar9 + 2);
      }
      pTVar7->n = (double)(int)pSVar4[uVar2 + uVar9];
      lVar10 = lVar10 + 8;
    }
    if (narray < t->asize) {
      pTVar7 = (TValue *)((ulong)(narray * 8) + (t->array).ptr64);
    }
    else {
      pTVar7 = lj_tab_setinth(L,t,narray);
    }
    pTVar7->u64 = 0xc170000000000000;
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

LJLIB_CF(jit_util_tracesnap)
{
  GCtrace *T = jit_checktrace(L);
  SnapNo sn = (SnapNo)lj_lib_checkint(L, 2);
  if (T && sn < T->nsnap) {
    SnapShot *snap = &T->snap[sn];
    SnapEntry *map = &T->snapmap[snap->mapofs];
    MSize n, nent = snap->nent;
    GCtab *t;
    lua_createtable(L, nent+2, 0);
    t = tabV(L->top-1);
    setintV(lj_tab_setint(L, t, 0), (int32_t)snap->ref - REF_BIAS);
    setintV(lj_tab_setint(L, t, 1), (int32_t)snap->nslots);
    for (n = 0; n < nent; n++)
      setintV(lj_tab_setint(L, t, (int32_t)(n+2)), (int32_t)map[n]);
    setintV(lj_tab_setint(L, t, (int32_t)(nent+2)), (int32_t)SNAP(255, 0, 0));
    return 1;
  }
  return 0;
}